

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

bool __thiscall slang::driver::Driver::reportDiagnostics(Driver *this,bool quiet)

{
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  format_args args;
  string_view contents;
  string_view fmt;
  bool bVar1;
  __optional_eq_t<std::__cxx11::basic_string<char>,_char[2]> _Var2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  element_type *peVar6;
  char *pcVar7;
  byte in_SIL;
  long in_RDI;
  DiagnosticEngine *this_00;
  string_view sVar8;
  string diagStr;
  bool succeeded;
  bool hasDiagsStdout;
  char (*in_stack_fffffffffffffd68) [2];
  color_type in_stack_fffffffffffffd70;
  TextDiagnosticClient *in_stack_fffffffffffffd78;
  char *pcVar9;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd80;
  char *pcVar10;
  char *in_stack_fffffffffffffd90;
  size_t in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  char *local_250;
  int local_244;
  undefined1 local_240 [7];
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  path *in_stack_fffffffffffffdd0;
  char *pcVar11;
  undefined1 local_220 [32];
  __sv_type local_200;
  color_type local_1dc [6];
  color_type local_1ac [5];
  string_view local_180;
  __sv_type local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string_view local_108;
  byte local_f3;
  byte local_f2;
  byte local_f1;
  int local_e8 [4];
  char *local_d8 [2];
  int local_c8 [4];
  undefined1 local_b8 [16];
  undefined8 local_a8;
  int *local_a0;
  char *local_98;
  undefined8 uStack_90;
  char **local_88;
  int *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  undefined8 uStack_60;
  undefined1 *local_58;
  int local_4c;
  int *local_48;
  int local_3c;
  int *local_38;
  path *in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  
  local_f1 = in_SIL & 1;
  local_f2 = 0;
  iVar3 = DiagnosticEngine::getNumErrors((DiagnosticEngine *)(in_RDI + 0xe98));
  local_f3 = iVar3 == 0;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_> *)
                     0x2cd27c);
  if (bVar1) {
    std::unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>::operator->
              ((unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_> *)0x2cd293);
    JsonWriter::endArray((JsonWriter *)in_stack_fffffffffffffda0);
  }
  _Var2 = std::operator==((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  if (_Var2) {
    local_f2 = 1;
    std::unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>::operator->
              ((unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_> *)0x2cd2d9);
    local_108 = JsonWriter::view((JsonWriter *)in_stack_fffffffffffffd70);
    text._M_str = (char *)in_stack_fffffffffffffd80;
    text._M_len = (size_t)in_stack_fffffffffffffd78;
    OS::print(text);
    sVar8._M_str = in_stack_fffffffffffffd90;
    sVar8._M_len = in_stack_fffffffffffffd98;
  }
  else {
    std::__shared_ptr_access<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2cd31c);
    in_stack_fffffffffffffda0 = &local_128;
    TextDiagnosticClient::getString_abi_cxx11_(in_stack_fffffffffffffd78);
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (in_stack_fffffffffffffda0);
    local_f2 = 1 < sVar5;
    local_138 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffd70);
    text_00._M_str = (char *)in_stack_fffffffffffffd80;
    text_00._M_len = (size_t)in_stack_fffffffffffffd78;
    OS::printE(text_00);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_> *)
                       0x2cd389);
    sVar8._M_str = in_stack_fffffffffffffd90;
    sVar8._M_len = in_stack_fffffffffffffd98;
    if (bVar1) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x2cd3a3);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (in_stack_fffffffffffffdd0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                 (format)((ulong)_local_240 >> 0x38));
      std::unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>::operator->
                ((unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_> *)0x2cd3cb)
      ;
      sVar8 = JsonWriter::view((JsonWriter *)in_stack_fffffffffffffd70);
      contents._M_str = in_stack_ffffffffffffffe0;
      contents._M_len = in_stack_ffffffffffffffd8;
      local_180 = sVar8;
      OS::writeFile(in_stack_ffffffffffffffd0,contents);
      std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffd70);
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd70);
  }
  if ((local_f1 & 1) == 0) {
    if ((local_f2 & 1) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
      text_01._M_str = (char *)in_stack_fffffffffffffd80;
      text_01._M_len = (size_t)in_stack_fffffffffffffd78;
      OS::print(text_01);
    }
    if ((local_f3 & 1) == 0) {
      peVar6 = std::
               __shared_ptr_access<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2cd547);
      ::fmt::v11::detail::color_type::color_type
                (local_1dc,(peVar6->super_DiagnosticClient).field_0x1b);
      ::fmt::v11::fg(in_stack_fffffffffffffd70);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
      text_04._M_str = (char *)in_stack_fffffffffffffda0;
      text_04._M_len = sVar8._M_len;
      OS::print((text_style *)sVar8._M_str,text_04);
    }
    else {
      peVar6 = std::
               __shared_ptr_access<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2cd4dd);
      ::fmt::v11::detail::color_type::color_type
                (local_1ac,(peVar6->super_DiagnosticClient).field_0x1d);
      ::fmt::v11::fg(in_stack_fffffffffffffd70);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
      text_03._M_str = (char *)in_stack_fffffffffffffda0;
      text_03._M_len = sVar8._M_len;
      OS::print((text_style *)sVar8._M_str,text_03);
    }
    pcVar11 = "{} error{}, {} warning{}\n";
    this_00 = (DiagnosticEngine *)(in_RDI + 0xe98);
    iVar3 = DiagnosticEngine::getNumErrors(this_00);
    iVar4 = DiagnosticEngine::getNumErrors(this_00);
    pcVar9 = "";
    _local_240 = "s";
    pcVar10 = "s";
    if (iVar4 == 1) {
      _local_240 = "";
    }
    local_244 = DiagnosticEngine::getNumWarnings(this_00);
    iVar4 = DiagnosticEngine::getNumWarnings(this_00);
    pcVar7 = pcVar10;
    if (iVar4 == 1) {
      pcVar7 = pcVar9;
    }
    local_58 = local_220;
    uStack_60 = 0x19;
    local_70 = &stack0xfffffffffffffdcc;
    local_78 = local_240;
    local_80 = &local_244;
    local_88 = &local_250;
    uStack_90 = 0x19;
    local_38 = local_e8;
    local_d8[0] = _local_240;
    local_48 = local_c8;
    local_4c = local_244;
    local_a8 = 0xc1c1;
    fmt.size_ = (size_t)local_d8;
    fmt.data_ = _local_240;
    args.field_1.values_ = (value<fmt::v11::context> *)local_b8;
    args.desc_ = (unsigned_long_long)local_250;
    local_250 = pcVar7;
    local_98 = pcVar11;
    local_68 = pcVar11;
    local_3c = iVar3;
    local_e8[0] = iVar3;
    local_c8[0] = local_4c;
    local_a0 = local_38;
    ::fmt::v11::vformat_abi_cxx11_(fmt,args);
    local_200 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           this_00);
    text_02._M_str = pcVar10;
    text_02._M_len = (size_t)pcVar9;
    OS::print(text_02);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  }
  return (bool)(local_f3 & 1);
}

Assistant:

bool Driver::reportDiagnostics(bool quiet) {
    bool hasDiagsStdout = false;
    bool succeeded = diagEngine.getNumErrors() == 0;

    if (jsonWriter)
        jsonWriter->endArray();

    if (options.diagJson == "-") {
        // If we're printing JSON diagnostics to stdout don't also
        // print the text diagnostics.
        hasDiagsStdout = true;
        OS::print(jsonWriter->view());
    }
    else {
        std::string diagStr = textDiagClient->getString();
        hasDiagsStdout = diagStr.size() > 1;
        OS::printE(diagStr);

        if (jsonWriter)
            OS::writeFile(*options.diagJson, jsonWriter->view());
    }

    if (!quiet) {
        if (hasDiagsStdout)
            OS::print("\n");

        if (succeeded)
            OS::print(fg(textDiagClient->highlightColor), "Build succeeded: ");
        else
            OS::print(fg(textDiagClient->errorColor), "Build failed: ");

        OS::print(fmt::format("{} error{}, {} warning{}\n", diagEngine.getNumErrors(),
                              diagEngine.getNumErrors() == 1 ? "" : "s",
                              diagEngine.getNumWarnings(),
                              diagEngine.getNumWarnings() == 1 ? "" : "s"));
    }

    return succeeded;
}